

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall cfd::core::DescriptorNode::AnalyzeKey(DescriptorNode *this)

{
  string *args;
  bool bVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  CfdException *pCVar5;
  ulong uVar6;
  long lVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string key;
  string path;
  string errmsg;
  ExtPrivkey xpriv;
  string hdkey_top;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  ExtPubkey xpub;
  
  args = &this->key_info_;
  ::std::__cxx11::string::_M_assign((string *)args);
  if (*(this->value_)._M_dataplus._M_p == '[') {
    lVar3 = ::std::__cxx11::string::find((char *)&this->value_,0x53128a);
    if (lVar3 != -1) {
      ::std::__cxx11::string::substr((ulong)&xpriv,(ulong)&this->value_);
      ::std::__cxx11::string::operator=((string *)args,(string *)&xpriv);
      ::std::__cxx11::string::~string((string *)&xpriv);
    }
  }
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x45e;
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "AnalyzeKey";
  logger::info<std::__cxx11::string&>((CfdSourceLocation *)&xpriv,"key_info_ = {}",args);
  hdkey_top._M_dataplus._M_p = (pointer)&hdkey_top.field_2;
  hdkey_top._M_string_length = 0;
  hdkey_top.field_2._M_local_buf[0] = '\0';
  if (4 < (this->key_info_)._M_string_length) {
    ::std::__cxx11::string::substr((ulong)&xpriv,(ulong)args);
    ::std::__cxx11::string::operator=((string *)&hdkey_top,(string *)&xpriv);
    ::std::__cxx11::string::~string((string *)&xpriv);
  }
  bVar1 = ::std::operator==(&hdkey_top,"pub");
  if (!bVar1) {
    bVar1 = ::std::operator==(&hdkey_top,"prv");
    if (!bVar1) {
      this->key_type_ = kDescriptorKeyPublic;
      Pubkey::Pubkey((Pubkey *)&xpub);
      SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&path);
      Privkey::Privkey((Privkey *)&xpriv);
      ByteData::ByteData((ByteData *)&key,args);
      bVar1 = Pubkey::IsValid((ByteData *)&key);
      if (bVar1) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
        Pubkey::Pubkey((Pubkey *)&errmsg,(ByteData *)&local_b8);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub,&errmsg);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b8)
        ;
        bVar1 = ::std::operator==(&this->parent_kind_,"tr");
        if (bVar1) {
          errmsg._M_dataplus._M_p = "cfdcore_descriptor.cpp";
          errmsg._M_string_length._0_4_ = 0x4ab;
          errmsg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_35ba76;
          logger::warn<>((CfdSourceLocation *)&errmsg,
                         "Failed to taproot key. taproot is xonly pubkey only.");
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&errmsg,"Failed to taproot key. taproot is xonly pubkey only.",
                     (allocator *)&list);
          CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&errmsg);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        Pubkey::GetHex_abi_cxx11_(&errmsg,(Pubkey *)&xpub);
LAB_002b6175:
        ::std::__cxx11::string::operator=((string *)args,(string *)&errmsg);
        ::std::__cxx11::string::~string((string *)&errmsg);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      }
      else {
        bVar1 = ::std::operator==(&this->parent_kind_,"tr");
        if (bVar1) {
          sVar4 = ByteData::GetDataSize((ByteData *)&key);
          if (sVar4 == 0x20) {
            SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&errmsg,(ByteData *)&key);
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&path,&errmsg);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
            SchnorrPubkey::CreatePubkey((Pubkey *)&errmsg,(SchnorrPubkey *)&path,false);
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub,&errmsg);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
            this->key_type_ = kDescriptorKeySchnorr;
            SchnorrPubkey::GetHex_abi_cxx11_(&errmsg,(SchnorrPubkey *)&path);
            goto LAB_002b6175;
          }
        }
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = true;
        key._M_dataplus._M_p = (pointer)((ulong)key._M_dataplus._M_p._4_4_ << 0x20);
        bVar1 = Privkey::HasWif(args,(NetType *)&key,(bool *)&list);
        if (bVar1) {
          Privkey::FromWif((Privkey *)&errmsg,args,(NetType)key._M_dataplus._M_p,
                           (bool)list.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_1_);
          Privkey::operator=((Privkey *)&xpriv,(Privkey *)&errmsg);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
        }
        bVar1 = Privkey::IsValid((Privkey *)&xpriv);
        if (!bVar1) {
          errmsg._M_dataplus._M_p = "cfdcore_descriptor.cpp";
          errmsg._M_string_length._0_4_ = 0x4ce;
          errmsg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_35ba76;
          logger::warn<>((CfdSourceLocation *)&errmsg,"Failed to privkey.");
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&errmsg,"privkey invalid.",(allocator *)&local_d0);
          CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&errmsg);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        Privkey::GeneratePubkey
                  ((Pubkey *)&errmsg,(Privkey *)&xpriv,
                   (bool)list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub,&errmsg);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
        Pubkey::GetHex_abi_cxx11_(&errmsg,(Pubkey *)&xpub);
        ::std::__cxx11::string::operator=((string *)args,(string *)&errmsg);
        ::std::__cxx11::string::~string((string *)&errmsg);
      }
      bVar1 = Pubkey::IsCompress((Pubkey *)&xpub);
      this->is_uncompressed_key_ = !bVar1;
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xpriv);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub);
      goto LAB_002b65f1;
    }
  }
  this->key_type_ = kDescriptorKeyBip32;
  bVar1 = ::std::operator==(&hdkey_top,"prv");
  if (bVar1) {
    this->key_type_ = kDescriptorKeyBip32Priv;
  }
  ExtPubkey::ExtPubkey(&xpub);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&xpriv,"/",(allocator *)&errmsg);
  StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&list,(string *)args,(string *)&xpriv);
  ::std::__cxx11::string::~string((string *)&xpriv);
  ::std::__cxx11::string::_M_assign((string *)&key);
  if ((ulong)((long)list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             CONCAT71(list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_)) < 0x21) {
    bVar1 = false;
  }
  else {
    lVar3 = ::std::__cxx11::string::find((char *)args,0x4f5c11);
    if (lVar3 != -1) {
      this->need_arg_num_ = 1;
    }
    lVar3 = 0x20;
    for (uVar6 = 1;
        lVar7 = CONCAT71(list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_),
        uVar6 < (ulong)((long)list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar7 >> 5);
        uVar6 = uVar6 + 1) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar7 + lVar3),"*");
      lVar7 = CONCAT71(list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                       list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (bVar1) break;
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar7 + lVar3),"*\'");
      bVar1 = true;
      lVar7 = CONCAT71(list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                       list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (bVar2) goto LAB_002b635b;
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar7 + lVar3),"*h");
      if (bVar2) {
        lVar7 = CONCAT71(list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
        goto LAB_002b635b;
      }
      if (uVar6 != 1) {
        ::std::__cxx11::string::append((char *)&path);
      }
      ::std::__cxx11::string::append((string *)&path);
      lVar3 = lVar3 + 0x20;
    }
    bVar1 = false;
LAB_002b635b:
    if (uVar6 + 1 <
        (ulong)((long)list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - lVar7 >> 5)) {
      xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
      xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x480;
      xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = "AnalyzeKey";
      logger::warn<>((CfdSourceLocation *)&xpriv,
                     "Failed to extkey path. A \'*\' can only be specified at the end.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&xpriv,"Failed to extkey path. A \'*\' can only be specified at the end."
                 ,(allocator *)&errmsg);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&xpriv);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x489;
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "AnalyzeKey";
  logger::info<std::__cxx11::string&,std::__cxx11::string&>
            ((CfdSourceLocation *)&xpriv,"key = {}, path = {}",&key,&path);
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::ExtPrivkey(&xpriv,&key);
    ::std::__cxx11::string::_M_assign((string *)&this->base_extkey_);
    if (path._M_string_length != 0) {
      ExtPrivkey::DerivePrivkey((ExtPrivkey *)&errmsg,&xpriv,&path);
      ExtPrivkey::operator=(&xpriv,(ExtPrivkey *)&errmsg);
      ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&errmsg);
    }
    ExtPrivkey::ToString_abi_cxx11_(&errmsg,&xpriv);
    ::std::__cxx11::string::operator=((string *)args,(string *)&errmsg);
    ::std::__cxx11::string::~string((string *)&errmsg);
    ExtPrivkey::GetPubTweakSum((ByteData256 *)&local_d0,&xpriv);
    ByteData256::GetHex_abi_cxx11_(&errmsg,(ByteData256 *)&local_d0);
    ::std::__cxx11::string::operator=((string *)&this->tweak_sum_,(string *)&errmsg);
    ::std::__cxx11::string::~string((string *)&errmsg);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
    ExtPrivkey::~ExtPrivkey(&xpriv);
  }
  else {
    if (bVar1) {
      xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
      xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x492;
      xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = "AnalyzeKey";
      logger::warn<>((CfdSourceLocation *)&xpriv,"Failed to extPubkey. hardened is extPrivkey only."
                    );
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&xpriv,"Failed to extPubkey. hardened is extPrivkey only.",
                 (allocator *)&errmsg);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&xpriv);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::ExtPubkey((ExtPubkey *)&xpriv,&key);
    ExtPubkey::operator=(&xpub,(ExtPubkey *)&xpriv);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&xpriv);
    ::std::__cxx11::string::_M_assign((string *)&this->base_extkey_);
    if (path._M_string_length != 0) {
      ExtPubkey::DerivePubkey((ExtPubkey *)&xpriv,&xpub,&path);
      ExtPubkey::operator=(&xpub,(ExtPubkey *)&xpriv);
      ExtPubkey::~ExtPubkey((ExtPubkey *)&xpriv);
    }
    ExtPubkey::ToString_abi_cxx11_((string *)&xpriv,&xpub);
    ::std::__cxx11::string::operator=((string *)args,(string *)&xpriv);
    ::std::__cxx11::string::~string((string *)&xpriv);
    ExtPubkey::GetPubTweakSum((ByteData256 *)&errmsg,&xpub);
    ByteData256::GetHex_abi_cxx11_((string *)&xpriv,(ByteData256 *)&errmsg);
    ::std::__cxx11::string::operator=((string *)&this->tweak_sum_,(string *)&xpriv);
    ::std::__cxx11::string::~string((string *)&xpriv);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  ::std::__cxx11::string::~string((string *)&key);
  ::std::__cxx11::string::~string((string *)&path);
  ExtPubkey::~ExtPubkey(&xpub);
LAB_002b65f1:
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x4d7;
  xpriv.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "AnalyzeKey";
  logger::info<std::__cxx11::string&>((CfdSourceLocation *)&xpriv,"key_info = {}",args);
  ::std::__cxx11::string::~string((string *)&hdkey_top);
  return;
}

Assistant:

void DescriptorNode::AnalyzeKey() {
  // key analyze
  key_info_ = value_;
  if (value_[0] == '[') {
    // key origin information check
    // cut to ']'
    auto pos = value_.find("]");
    if (pos != std::string::npos) {
      key_info_ = value_.substr(pos + 1);
    }
  }
  // derive key check (xpub,etc)
  info(CFD_LOG_SOURCE, "key_info_ = {}", key_info_);
  std::string hdkey_top;
  if (key_info_.size() > 4) {
    hdkey_top = key_info_.substr(1, 3);
  }
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
    }
    ExtPubkey xpub;
    std::string path;
    std::string key;
    bool hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info_, "/");
    key = list[0];
    if (list.size() > 1) {
      if (key_info_.find("*") != std::string::npos) {
        need_arg_num_ = 1;
      }
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h")) {
          hardened = true;
          break;
        }
        if (index != 1) {
          path += "/";
        }
        path += list[index];
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
    }
    info(CFD_LOG_SOURCE, "key = {}, path = {}", key, path);
    if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
      ExtPrivkey xpriv(key);
      base_extkey_ = key;
      if (!path.empty()) xpriv = xpriv.DerivePrivkey(path);
      key_info_ = xpriv.ToString();
      tweak_sum_ = xpriv.GetPubTweakSum().GetHex();
    } else if (hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      xpub = ExtPubkey(key);
      base_extkey_ = key;
      if (!path.empty()) xpub = xpub.DerivePubkey(path);
      key_info_ = xpub.ToString();
      tweak_sum_ = xpub.GetPubTweakSum().GetHex();
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    Pubkey pubkey;
    SchnorrPubkey schnorr_pubkey;
    Privkey privkey;
    try {
      // pubkey format check
      ByteData bytes(key_info_);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey = Pubkey(bytes);
        if (parent_kind_ == "tr") {
          warn(
              CFD_LOG_SOURCE,
              "Failed to taproot key. taproot is xonly pubkey only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to taproot key. taproot is xonly pubkey only.");
        }
        key_info_ = pubkey.GetHex();
      } else if (
          (parent_kind_ == "tr") &&
          (bytes.GetDataSize() == SchnorrPubkey::kSchnorrPubkeySize)) {
        // xonly pubkey
        schnorr_pubkey = SchnorrPubkey(bytes);
        pubkey = schnorr_pubkey.CreatePubkey();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
        key_info_ = schnorr_pubkey.GetHex();
      } else {
        is_wif = true;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (errmsg.find("hex to byte convert error.") != std::string::npos) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      // privkey WIF check
      bool is_compressed = true;
      NetType nettype = NetType::kMainnet;
      bool has_wif = Privkey::HasWif(key_info_, &nettype, &is_compressed);
      if (has_wif) {
        privkey = Privkey::FromWif(key_info_, nettype, is_compressed);
      }
      if (!privkey.IsValid()) {
        warn(CFD_LOG_SOURCE, "Failed to privkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "privkey invalid.");
      }
      pubkey = privkey.GeneratePubkey(is_compressed);
      key_info_ = pubkey.GetHex();
    }
    is_uncompressed_key_ = !pubkey.IsCompress();
  }
  info(CFD_LOG_SOURCE, "key_info = {}", key_info_);
}